

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void mkfount(level *lev,int mazeflag,mkroom *croom)

{
  undefined1 *puVar1;
  boolean bVar2;
  uint uVar3;
  undefined8 in_RAX;
  int iVar4;
  undefined4 in_register_00000034;
  int iVar5;
  int iVar6;
  coord m;
  undefined8 uStack_38;
  
  iVar6 = 200;
  uStack_38 = in_RAX;
  do {
    bVar2 = somexy(lev,(mkroom *)CONCAT44(in_register_00000034,mazeflag),
                   (coord *)((long)&uStack_38 + 6));
    if (bVar2 == '\0') {
      return;
    }
    bVar2 = occupied(lev,uStack_38._6_1_,uStack_38._7_1_);
    if (bVar2 == '\0') {
      iVar4 = (int)uStack_38._6_1_;
      iVar5 = (int)uStack_38._7_1_;
      bVar2 = bydoor(lev,uStack_38._6_1_,uStack_38._7_1_);
      if (bVar2 == '\0') {
        lev->locations[iVar4][iVar5].typ = '\x1c';
        uVar3 = mt_random();
        if (uVar3 * -0x49249249 < 0x24924925) {
          puVar1 = &lev->locations[uStack_38._6_1_][uStack_38._7_1_].field_0x6;
          *(uint *)puVar1 = *(uint *)puVar1 | 0x200;
        }
        (lev->flags).nfountains = (lev->flags).nfountains + '\x01';
        return;
      }
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

static void mkfount(struct level *lev, int mazeflag, struct mkroom *croom)
{
	coord m;
	int tryct = 0;

	do {
	    if (++tryct > 200) return;
	    if (mazeflag)
		mazexy(lev, &m);
	    else
		if (!somexy(lev, croom, &m))
		    return;
	} while (occupied(lev, m.x, m.y) || bydoor(lev, m.x, m.y));

	/* Put a fountain at m.x, m.y */
	lev->locations[m.x][m.y].typ = FOUNTAIN;
	/* Is it a "blessed" fountain? (affects drinking from fountain) */
	if (!rn2(7)) lev->locations[m.x][m.y].blessedftn = 1;

	lev->flags.nfountains++;
}